

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

int __thiscall
slang::SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>::copy
          (SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  undefined8 *puVar1;
  size_type sVar2;
  pointer pCVar3;
  size_t size;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  byte *pbVar9;
  long lVar10;
  bool bVar11;
  
  if (this->len == 0) {
    return 0;
  }
  size = this->len * 0x30;
  pbVar9 = (byte *)(*(long *)(*(long *)dst + 8) + 7U & 0xfffffffffffffff8);
  if (*(byte **)(dst + 8) < pbVar9 + size) {
    pbVar9 = BumpAllocator::allocateSlow((BumpAllocator *)dst,size,8);
  }
  else {
    *(byte **)(*(long *)dst + 8) = pbVar9 + size;
  }
  sVar2 = this->len;
  if (sVar2 != 0) {
    pCVar3 = this->data_;
    lVar10 = 0;
    do {
      puVar1 = (undefined8 *)((long)&(pCVar3->expressions)._M_ptr + lVar10);
      uVar4 = *puVar1;
      uVar5 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pCVar3->item).super_ProdBase.kind + lVar10);
      uVar6 = *puVar1;
      uVar7 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pCVar3->item).args._M_ptr + lVar10);
      uVar8 = puVar1[1];
      *(undefined8 *)(pbVar9 + lVar10 + 0x20) = *puVar1;
      *(undefined8 *)(pbVar9 + lVar10 + 0x20 + 8) = uVar8;
      *(undefined8 *)(pbVar9 + lVar10 + 0x10) = uVar6;
      *(undefined8 *)(pbVar9 + lVar10 + 0x10 + 8) = uVar7;
      *(undefined8 *)(pbVar9 + lVar10) = uVar4;
      *(undefined8 *)(pbVar9 + lVar10 + 8) = uVar5;
      bVar11 = sVar2 * 0x30 + -0x30 == lVar10;
      if (bVar11) break;
      lVar10 = lVar10 + 0x30;
    } while (!bVar11);
  }
  return (int)pbVar9;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }